

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int gost_cipher_init_cnt(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,gost_subst_block *block)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  void *__src;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  gost_init((gost_ctx *)(lVar2 + 0x1c),block);
  *(undefined8 *)(lVar2 + 4) = 0x100000000;
  if (key != (uchar *)0x0) {
    gost_key((gost_ctx *)(lVar2 + 0x1c),key);
  }
  if (iv != (uchar *)0x0) {
    pvVar3 = (void *)EVP_CIPHER_CTX_original_iv(ctx);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    memcpy(pvVar3,iv,(long)iVar1);
  }
  pvVar3 = (void *)EVP_CIPHER_CTX_iv_noconst(ctx);
  __src = (void *)EVP_CIPHER_CTX_original_iv(ctx);
  iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
  pvVar3 = memcpy(pvVar3,__src,(long)iVar1);
  return (int)pvVar3;
}

Assistant:

static int gost_cipher_init_cnt(EVP_CIPHER_CTX *ctx,
                                const unsigned char *key,
                                const unsigned char *iv,
                                gost_subst_block * block)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_init(&(c->cctx), block);
    c->key_meshing = 1;
    c->count = 0;
    if (key)
        gost_key(&(c->cctx), key);
    if (iv) {
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv,
               EVP_CIPHER_CTX_iv_length(ctx));
    }
    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx),
           EVP_CIPHER_CTX_original_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx));
    return 1;
}